

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::RefreshBackground(DBaseStatusBar *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FTexture *pFVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  float aspect;
  
  aspect = ActiveRatio((screen->super_DSimpleCanvas).super_DCanvas.Width,
                       (screen->super_DSimpleCanvas).super_DCanvas.Height,(float *)0x0);
  if ((aspect < 1.5) || (this->Scaled == false)) {
    uVar3 = *(uint *)&(this->super_DObject).field_0x24;
    uVar6 = uVar3;
  }
  else {
    iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = AspectMultiplier(aspect);
    uVar3 = *(uint *)&(this->super_DObject).field_0x24;
    uVar6 = ((0x30 - iVar2) * iVar1) / 0x60;
  }
  piVar5 = &this->ST_Y;
  if (uVar6 != uVar3) {
    piVar5 = &ST_Y;
  }
  if ((int)uVar6 < 1) {
    piVar5 = &ST_Y;
  }
  uVar3 = *piVar5;
  if (this->CompleteBorder == false) {
    if ((int)uVar3 < (screen->super_DSimpleCanvas).super_DCanvas.Height) {
      V_DrawBorder(uVar6 + 1,uVar3,(screen->super_DSimpleCanvas).super_DCanvas.Width,uVar3 + 1);
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      V_DrawBorder(uVar6 + 1,iVar1 + -1,(screen->super_DSimpleCanvas).super_DCanvas.Width,iVar1);
    }
  }
  else {
    uVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  }
  if (0 < (int)uVar6) {
    if (this->CompleteBorder == false) {
      if ((aspect < 1.5) || (this->Scaled == false)) {
        uVar7 = this->HorizontalResolution + *(int *)&(this->super_DObject).field_0x24;
      }
      else {
        iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar2 = AspectMultiplier(aspect);
        uVar7 = ((0x30 - iVar2) * iVar1 + 0x5f) / -0x60 + iVar1;
      }
    }
    else {
      uVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    }
    V_DrawBorder(0,uVar3,uVar6 + 1,(screen->super_DSimpleCanvas).super_DCanvas.Height);
    V_DrawBorder(uVar7 - 1,uVar3,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                 (screen->super_DSimpleCanvas).super_DCanvas.Height);
    if (9 < setblocks) {
      pFVar4 = FTextureManager::operator[](&TexMan,gameinfo.Border.b.Chars);
      if (pFVar4 != (FTexture *)0x0) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,0,(ulong)uVar3,(ulong)uVar6,(ulong)(pFVar4->Height + uVar3),pFVar4,1);
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,(ulong)uVar7,(ulong)uVar3,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(pFVar4->Height + uVar3),pFVar4,1);
      }
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::RefreshBackground () const
{
	int x, x2, y;

	float ratio = ActiveRatio (SCREENWIDTH, SCREENHEIGHT);
	x = (ratio < 1.5f || !Scaled) ? ST_X : SCREENWIDTH*(48-AspectMultiplier(ratio))/(48*2);
	y = x == ST_X && x > 0 ? ST_Y : ::ST_Y;

	if(!CompleteBorder)
	{
		if(y < SCREENHEIGHT)
		{
			V_DrawBorder (x+1, y, SCREENWIDTH, y+1);
			V_DrawBorder (x+1, SCREENHEIGHT-1, SCREENWIDTH, SCREENHEIGHT);
		}
	}
	else
	{
		x = SCREENWIDTH;
	}

	if (x > 0)
	{
		if(!CompleteBorder)
		{
			x2 = ratio < 1.5f || !Scaled ? ST_X+HorizontalResolution :
				SCREENWIDTH - (SCREENWIDTH*(48-AspectMultiplier(ratio))+48*2-1)/(48*2);
		}
		else
		{
			x2 = SCREENWIDTH;
		}

		V_DrawBorder (0, y, x+1, SCREENHEIGHT);
		V_DrawBorder (x2-1, y, SCREENWIDTH, SCREENHEIGHT);

		if (setblocks >= 10)
		{
			FTexture *p = TexMan[gameinfo.Border.b];
			if (p != NULL)
			{
				screen->FlatFill(0, y, x, y + p->GetHeight(), p, true);
				screen->FlatFill(x2, y, SCREENWIDTH, y + p->GetHeight(), p, true);
			}
		}
	}
}